

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3843.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementHexaANCF_3843::ComputeMassMatrixAndGravityForce(ChElementHexaANCF_3843 *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  double *pdVar5;
  double *pdVar6;
  int iVar7;
  undefined1 (*pauVar8) [64];
  Index j;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  Index outer;
  uint it_zeta;
  long lVar13;
  bool bVar14;
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  SrcEvaluatorType srcEvaluator;
  DstEvaluatorType dstEvaluator;
  VectorN Sxi_compact;
  type tmp;
  ChMatrixNM<double,_NSF,_NSF> MassMatrixCompactSquare;
  add_assign_op<double,_double> local_42f1;
  ulong local_42f0;
  ulong local_42e8;
  undefined1 *local_42e0;
  double local_42d8;
  evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_32,_32,_0,_32,_32>_>_> local_42d0;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_32,_32,_1,_32,_32>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_32,_32,_0,_32,_32>_>,_Eigen::internal::add_assign_op<double,_double>,_0>
  *local_42c8;
  double local_42c0;
  double local_42b8;
  double local_42b0;
  double local_42a8;
  double local_42a0;
  evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_32,_32,_1,_32,_32>_>_> local_4298;
  double local_4290;
  VectorN *local_4288;
  undefined1 local_4280 [128];
  undefined1 local_4200 [64];
  undefined1 local_41c0 [64];
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_32,_32,_1,_32,_32>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_32,_32,_0,_32,_32>_>,_Eigen::internal::add_assign_op<double,_double>,_0>
  local_4180 [8];
  double local_4080;
  VectorN *pVStack_4078;
  undefined1 local_3fc0 [8000];
  undefined1 local_2080 [8272];
  
  local_42e0 = local_2080;
  memset(local_42e0,0,0x2000);
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.
  m_data.array[0] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.
  m_data.array[1] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.
  m_data.array[2] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.
  m_data.array[3] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.
  m_data.array[4] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.
  m_data.array[5] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.
  m_data.array[6] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.
  m_data.array[7] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.
  m_data.array[8] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.
  m_data.array[9] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.
  m_data.array[10] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.
  m_data.array[0xb] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.
  m_data.array[0xc] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.
  m_data.array[0xd] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.
  m_data.array[0xe] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.
  m_data.array[0xf] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.
  m_data.array[0x10] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.
  m_data.array[0x11] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.
  m_data.array[0x12] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.
  m_data.array[0x13] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.
  m_data.array[0x14] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.
  m_data.array[0x15] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.
  m_data.array[0x16] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.
  m_data.array[0x17] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.
  m_data.array[0x18] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.
  m_data.array[0x19] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.
  m_data.array[0x1a] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.
  m_data.array[0x1b] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.
  m_data.array[0x1c] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.
  m_data.array[0x1d] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.
  m_data.array[0x1e] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.
  m_data.array[0x1f] = 0.0;
  peVar4 = (this->m_material).
           super___shared_ptr<chrono::fea::ChMaterialHexaANCF,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00 = (this->m_material).
            super___shared_ptr<chrono::fea::ChMaterialHexaANCF,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_42d8 = peVar4->m_rho;
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
    local_42d8 = peVar4->m_rho;
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  lVar13 = *(long *)(DAT_00b6ab20 + 0x48);
  lVar9 = *(long *)(DAT_00b6ab20 + 0x50);
  if (lVar9 != lVar13) {
    local_42f0 = 0;
    do {
      bVar14 = lVar9 != lVar13;
      lVar9 = lVar13;
      if (bVar14) {
        local_42e8 = 0;
        do {
          uVar11 = 0;
          do {
            local_42c0 = *(double *)(lVar13 + uVar11 * 8);
            lVar9 = *(long *)(static_tables_3843 + 0x48);
            local_42b8 = *(double *)(lVar13 + local_42e8 * 8);
            local_42a0 = *(double *)(lVar9 + local_42f0 * 8) * *(double *)(lVar9 + local_42e8 * 8) *
                         *(double *)(lVar9 + uVar11 * 8) * local_42d8;
            local_42b0 = *(double *)(lVar13 + local_42f0 * 8);
            local_42a8 = Calc_det_J_0xi(this,local_42b0,local_42b8,local_42c0);
            Calc_Sxi_compact(this,(VectorN *)local_4280,local_42b0,local_42b8,local_42c0);
            pauVar8 = (undefined1 (*) [64])local_3fc0;
            lVar9 = 0;
            local_4290 = local_42a8 * local_42a0;
            auVar1._8_8_ = 0;
            auVar1._0_8_ = local_4290;
            auVar15 = vbroadcastsd_avx512f(auVar1);
            auVar16 = vmulpd_avx512f(auVar15,local_4280._0_64_);
            auVar16 = vaddpd_avx512f(auVar16,*(undefined1 (*) [64])
                                              (this->m_GravForceScale).
                                              super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>
                                              .m_storage.m_data.array);
            *(undefined1 (*) [64])
             (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>
             .m_storage.m_data.array = auVar16;
            auVar16 = vmulpd_avx512f(auVar15,local_4280._64_64_);
            auVar16 = vaddpd_avx512f(auVar16,*(undefined1 (*) [64])
                                              ((this->m_GravForceScale).
                                               super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>
                                               .m_storage.m_data.array + 8));
            *(undefined1 (*) [64])
             ((this->m_GravForceScale).
              super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
             + 8) = auVar16;
            auVar16 = vmulpd_avx512f(auVar15,local_4200);
            auVar16 = vaddpd_avx512f(auVar16,*(undefined1 (*) [64])
                                              ((this->m_GravForceScale).
                                               super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>
                                               .m_storage.m_data.array + 0x10));
            *(undefined1 (*) [64])
             ((this->m_GravForceScale).
              super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
             + 0x10) = auVar16;
            auVar15 = vmulpd_avx512f(auVar15,local_41c0);
            auVar15 = vaddpd_avx512f(auVar15,*(undefined1 (*) [64])
                                              ((this->m_GravForceScale).
                                               super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>
                                               .m_storage.m_data.array + 0x18));
            *(undefined1 (*) [64])
             ((this->m_GravForceScale).
              super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
             + 0x18) = auVar15;
            auVar2._8_8_ = 0;
            auVar2._0_8_ = local_4290;
            auVar15 = vbroadcastsd_avx512f(auVar2);
            auVar16 = vmulpd_avx512f(auVar15,local_4280._0_64_);
            auVar17 = vmulpd_avx512f(auVar15,local_4280._64_64_);
            auVar18 = vmulpd_avx512f(auVar15,local_4200);
            auVar15 = vmulpd_avx512f(auVar15,local_41c0);
            local_4080 = local_4290;
            pVStack_4078 = (VectorN *)local_4280;
            do {
              lVar13 = lVar9 * 8;
              lVar9 = lVar9 + 1;
              auVar3._8_8_ = 0;
              auVar3._0_8_ = *(ulong *)(local_4280 + lVar13);
              auVar19 = vbroadcastsd_avx512f(auVar3);
              auVar20 = vmulpd_avx512f(auVar16,auVar19);
              auVar21 = vmulpd_avx512f(auVar17,auVar19);
              auVar22 = vmulpd_avx512f(auVar18,auVar19);
              auVar19 = vmulpd_avx512f(auVar15,auVar19);
              pauVar8[-3] = auVar20;
              pauVar8[-2] = auVar21;
              pauVar8[-1] = auVar22;
              *pauVar8 = auVar19;
              pauVar8 = pauVar8 + 4;
            } while (lVar9 != 0x20);
            local_42d0.m_d.data = (plainobjectbase_evaluator_data<double,_32>)&local_4080;
            local_4180[0].m_dst = (DstEvaluatorType *)&local_4298;
            local_4180[0].m_src = (SrcEvaluatorType *)&local_42d0;
            local_4180[0].m_functor = &local_42f1;
            lVar13 = 0;
            lVar9 = 0;
            local_4298.m_d.data = (plainobjectbase_evaluator_data<double,_32>)local_2080;
            local_42c8 = local_4180;
            local_4288 = (VectorN *)local_4280;
            local_4180[0].m_dstExpr = (DstXprType *)local_4298.m_d.data;
            do {
              pdVar5 = ((local_4180[0].m_src)->
                       super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_32,_32,_0,_32,_32>_>_>
                       ).m_d.data;
              pdVar6 = ((local_4180[0].m_dst)->
                       super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_32,_32,_1,_32,_32>_>_>
                       ).m_d.data;
              *(double *)((long)pdVar6 + lVar13) =
                   pdVar5[lVar9] + *(double *)((long)pdVar6 + lVar13);
              *(double *)((long)pdVar6 + lVar13 + 8) =
                   pdVar5[lVar9 + 0x20] + *(double *)((long)pdVar6 + lVar13 + 8);
              *(double *)((long)pdVar6 + lVar13 + 0x10) =
                   pdVar5[lVar9 + 0x40] + *(double *)((long)pdVar6 + lVar13 + 0x10);
              *(double *)((long)pdVar6 + lVar13 + 0x18) =
                   pdVar5[lVar9 + 0x60] + *(double *)((long)pdVar6 + lVar13 + 0x18);
              *(double *)((long)pdVar6 + lVar13 + 0x20) =
                   pdVar5[lVar9 + 0x80] + *(double *)((long)pdVar6 + lVar13 + 0x20);
              *(double *)((long)pdVar6 + lVar13 + 0x28) =
                   pdVar5[lVar9 + 0xa0] + *(double *)((long)pdVar6 + lVar13 + 0x28);
              Eigen::internal::
              copy_using_evaluator_DefaultTraversal_InnerUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_32,_32,_1,_32,_32>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_32,_32,_0,_32,_32>_>,_Eigen::internal::add_assign_op<double,_double>,_0>,_6,_32>
              ::run(local_4180,lVar9);
              lVar9 = lVar9 + 1;
              lVar13 = lVar13 + 0x100;
            } while (lVar9 != 0x20);
            uVar11 = (ulong)((int)uVar11 + 1);
            lVar13 = *(long *)(DAT_00b6ab20 + 0x48);
            uVar12 = *(long *)(DAT_00b6ab20 + 0x50) - lVar13 >> 3;
          } while (uVar11 < uVar12);
          local_42e8 = (ulong)((int)local_42e8 + 1);
        } while ((local_42e8 < uVar12) && (*(long *)(DAT_00b6ab20 + 0x50) != lVar13));
        lVar13 = *(long *)(DAT_00b6ab20 + 0x48);
        lVar9 = *(long *)(DAT_00b6ab20 + 0x50);
      }
      local_42f0 = (ulong)((int)local_42f0 + 1);
    } while (local_42f0 < (ulong)(lVar9 - lVar13 >> 3));
  }
  iVar7 = 0x20;
  uVar10 = 0;
  uVar11 = 0;
  do {
    uVar12 = (ulong)uVar10;
    lVar9 = 0x210 - uVar12;
    if (0x210 < uVar12) {
      lVar9 = 0;
    }
    lVar13 = 0;
    do {
      if (0x1f < (uVar11 + lVar13 | uVar11)) {
        __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                      "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, 32, 32, 1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, 32, 32, 1>, Level = 1]"
                     );
      }
      if (lVar9 == lVar13) {
        __assert_fail("index >= 0 && index < size()",
                      "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, 528, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, 528, 1>, Level = 1]"
                     );
      }
      (this->m_MassMatrix).super_PlainObjectBase<Eigen::Matrix<double,_528,_1,_0,_528,_1>_>.
      m_storage.m_data.array[uVar12 + lVar13] = *(double *)(local_42e0 + lVar13 * 8);
      lVar13 = lVar13 + 1;
    } while ((int)lVar13 + (int)uVar11 != 0x20);
    local_42e0 = local_42e0 + 0x108;
    uVar10 = uVar10 + iVar7;
    uVar11 = uVar11 + 1;
    iVar7 = iVar7 + -1;
    if (uVar11 == 0x20) {
      return;
    }
  } while( true );
}

Assistant:

void ChElementHexaANCF_3843::ComputeMassMatrixAndGravityForce() {
    // For this element, the mass matrix integrand is of order 7 in xi, 7 in eta, and 7 in zeta.
    // 4 GQ Points are needed in the xi, eta, and zeta directions for exact integration of the element's mass matrix,
    // even if the reference configuration is not straight. Since the major pieces of the generalized force due to
    // gravity can also be used to calculate the mass matrix, these calculations are performed at the same time.  Only
    // the matrix that scales the acceleration due to gravity is calculated at this time so that any changes to the
    // acceleration due to gravity in the system are correctly accounted for in the generalized internal force
    // calculation.

    ChQuadratureTables* GQTable = GetStaticGQTables();
    unsigned int GQ_idx_xi_eta_zeta = 3;  // 4 Point Gauss-Quadrature;

    // Mass Matrix in its compact matrix form.  Since the mass matrix is symmetric, just the upper diagonal entries will
    // be stored.
    ChMatrixNM<double, NSF, NSF> MassMatrixCompactSquare;

    // Set these to zeros since they will be incremented as the vector/matrix is calculated
    MassMatrixCompactSquare.setZero();
    m_GravForceScale.setZero();

    double rho = GetMaterial()->Get_rho();  // Density of the material for the element

    // Sum the contribution to the mass matrix and generalized force due to gravity at the current point
    for (unsigned int it_xi = 0; it_xi < GQTable->Lroots[GQ_idx_xi_eta_zeta].size(); it_xi++) {
        for (unsigned int it_eta = 0; it_eta < GQTable->Lroots[GQ_idx_xi_eta_zeta].size(); it_eta++) {
            for (unsigned int it_zeta = 0; it_zeta < GQTable->Lroots[GQ_idx_xi_eta_zeta].size(); it_zeta++) {
                double GQ_weight = GQTable->Weight[GQ_idx_xi_eta_zeta][it_xi] *
                                   GQTable->Weight[GQ_idx_xi_eta_zeta][it_eta] *
                                   GQTable->Weight[GQ_idx_xi_eta_zeta][it_zeta];
                double xi = GQTable->Lroots[GQ_idx_xi_eta_zeta][it_xi];
                double eta = GQTable->Lroots[GQ_idx_xi_eta_zeta][it_eta];
                double zeta = GQTable->Lroots[GQ_idx_xi_eta_zeta][it_zeta];
                double det_J_0xi = Calc_det_J_0xi(xi, eta, zeta);  // determinant of the element Jacobian (volume ratio)

                VectorN Sxi_compact;  // Vector of the Unique Normalized Shape Functions
                Calc_Sxi_compact(Sxi_compact, xi, eta, zeta);

                m_GravForceScale += (GQ_weight * rho * det_J_0xi) * Sxi_compact;
                MassMatrixCompactSquare += (GQ_weight * rho * det_J_0xi) * Sxi_compact * Sxi_compact.transpose();
            }
        }
    }

    // Store just the unique entries in the Mass Matrix in Compact Upper Triangular Form
    // since the full Mass Matrix is both sparse and symmetric
    unsigned int idx = 0;
    for (unsigned int i = 0; i < NSF; i++) {
        for (unsigned int j = i; j < NSF; j++) {
            m_MassMatrix(idx) = MassMatrixCompactSquare(i, j);
            idx++;
        }
    }
}